

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O0

void idx2::DecompressBufZstd(buffer *Input,buffer *Output)

{
  unsigned_long_long dstCapacity;
  size_t sVar1;
  size_t Result;
  unsigned_long_long OutputSize;
  buffer *Output_local;
  buffer *Input_local;
  
  dstCapacity = ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  sVar1 = ZSTD_decompress(Output->Data,dstCapacity,Input->Data,Input->Bytes);
  if (sVar1 != dstCapacity) {
    fprintf(_stderr,"Zstd decompression failed\n");
    exit(1);
  }
  return;
}

Assistant:

void
DecompressBufZstd(const buffer& Input, buffer* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  idx2_Assert(Size(*Output) >= (i64)OutputSize);
  size_t const Result = ZSTD_decompress(Output->Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}